

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

buf_chunk * get_non_full_tail(bufq *q)

{
  bufc_pool *pbVar1;
  buf_chunk *pbVar2;
  buf_chunk *pbVar3;
  size_t sVar4;
  buf_chunk *pbVar5;
  
  pbVar3 = q->tail;
  if ((pbVar3 != (buf_chunk *)0x0) && (pbVar3->w_offset < pbVar3->dlen)) {
    return pbVar3;
  }
  pbVar3 = q->spare;
  if (pbVar3 != (buf_chunk *)0x0) {
    q->spare = pbVar3->next;
    pbVar3->next = (buf_chunk *)0x0;
    pbVar3->r_offset = 0;
    pbVar3->w_offset = 0;
    goto LAB_001124b0;
  }
  if ((q->max_chunks <= q->chunk_count) && ((q->opts & 1) == 0)) {
    return (buf_chunk *)0x0;
  }
  pbVar1 = q->pool;
  if (pbVar1 == (bufc_pool *)0x0) {
    pbVar3 = (buf_chunk *)(*Curl_ccalloc)(1,q->chunk_size + 0x28);
    if (pbVar3 == (buf_chunk *)0x0) {
      return (buf_chunk *)0x0;
    }
    sVar4 = q->chunk_size;
LAB_001124a8:
    pbVar3->dlen = sVar4;
  }
  else {
    pbVar3 = pbVar1->spare;
    if (pbVar3 == (buf_chunk *)0x0) {
      pbVar3 = (buf_chunk *)(*Curl_ccalloc)(1,pbVar1->chunk_size + 0x28);
      if (pbVar3 == (buf_chunk *)0x0) {
        return (buf_chunk *)0x0;
      }
      sVar4 = pbVar1->chunk_size;
      goto LAB_001124a8;
    }
    pbVar1->spare = pbVar3->next;
    pbVar1->spare_count = pbVar1->spare_count - 1;
    pbVar3->next = (buf_chunk *)0x0;
    pbVar3->r_offset = 0;
    pbVar3->w_offset = 0;
  }
  q->chunk_count = q->chunk_count + 1;
LAB_001124b0:
  pbVar2 = q->tail;
  pbVar5 = (buf_chunk *)&q->tail;
  if (pbVar2 != (buf_chunk *)0x0) {
    pbVar5 = pbVar2;
  }
  pbVar5->next = pbVar3;
  (&q->head)[pbVar2 != (buf_chunk *)0x0] = pbVar3;
  return pbVar3;
}

Assistant:

static struct buf_chunk *get_non_full_tail(struct bufq *q)
{
  struct buf_chunk *chunk;

  if(q->tail && !chunk_is_full(q->tail))
    return q->tail;
  chunk = get_spare(q);
  if(chunk) {
    /* new tail, and possibly new head */
    if(q->tail) {
      q->tail->next = chunk;
      q->tail = chunk;
    }
    else {
      DEBUGASSERT(!q->head);
      q->head = q->tail = chunk;
    }
  }
  return chunk;
}